

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunningTest::ranToCompletion(RunningTest *this)

{
  RunningSection *in_RDI;
  
  if ((*(int *)&in_RDI->m_parent != 2) && (*(int *)&in_RDI->m_parent != 1)) {
    *(undefined4 *)&in_RDI->m_parent = 4;
  }
  *(undefined4 *)&in_RDI->m_parent = 3;
  if (*(long *)&in_RDI[1].field_0x18 != 0) {
    RunningSection::ranToCompletion(in_RDI);
    in_RDI[1].field_0x20 = 1;
  }
  return;
}

Assistant:

void ranToCompletion() {
            if( m_runStatus != RanAtLeastOneSection && m_runStatus != EncounteredASection )
                m_runStatus = RanToCompletionWithNoSections;
            m_runStatus = RanToCompletionWithSections;
            if( m_lastSectionToRun ) {
                m_lastSectionToRun->ranToCompletion();
                m_changed = true;
            }
        }